

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall ON_XMLNodePrivate::RemoveAllProperties(ON_XMLNodePrivate *this)

{
  ON_XMLProperty *pOVar1;
  int iVar2;
  undefined4 extraout_var;
  ON_XMLProperty *pDelete;
  ON_XMLProperty *pProp;
  ON_XMLNodePrivate *this_local;
  
  if (this->m_first_property != (ON_XMLProperty *)0x0) {
    pOVar1 = this->m_first_property;
    while (pDelete = pOVar1, pDelete != (ON_XMLProperty *)0x0) {
      iVar2 = (*pDelete->_vptr_ON_XMLProperty[5])();
      pOVar1 = (ON_XMLProperty *)CONCAT44(extraout_var,iVar2);
      if (pDelete != (ON_XMLProperty *)0x0) {
        (*pDelete->_vptr_ON_XMLProperty[1])();
      }
    }
    this->m_first_property = (ON_XMLProperty *)0x0;
  }
  return;
}

Assistant:

void ON_XMLNodePrivate::RemoveAllProperties(void)
{
  if (nullptr == m_first_property)
    return;

  auto* pProp = m_first_property;
  while (nullptr != pProp)
  {
    auto* pDelete = pProp;
    pProp = pProp->Next();
    delete pDelete;
  }

  m_first_property = nullptr;
}